

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestSchema::createExampleSchema(TestSchema *this)

{
  ValidSchema validComplexArray;
  ArraySchema complexArray;
  RecordSchema myRecord;
  allocator<char> local_59;
  undefined1 local_58 [24];
  string local_40 [32];
  RecordSchema local_20 [24];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"complex",(allocator<char> *)local_58)
  ;
  avro::RecordSchema::RecordSchema(local_20,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"real",&local_59);
  avro::DoubleSchema::DoubleSchema((DoubleSchema *)local_58);
  avro::RecordSchema::addField((string *)local_20,(Schema *)local_40);
  avro::Schema::~Schema((Schema *)local_58);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"imaginary",&local_59);
  avro::DoubleSchema::DoubleSchema((DoubleSchema *)local_58);
  avro::RecordSchema::addField((string *)local_20,(Schema *)local_40);
  avro::Schema::~Schema((Schema *)local_58);
  std::__cxx11::string::~string(local_40);
  avro::ArraySchema::ArraySchema((ArraySchema *)local_40,(Schema *)local_20);
  avro::ValidSchema::ValidSchema((ValidSchema *)local_58,(Schema *)local_40);
  avro::ValidSchema::toJson((ostream *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 8));
  avro::Schema::~Schema((Schema *)local_40);
  avro::Schema::~Schema((Schema *)local_20);
  return;
}

Assistant:

void createExampleSchema()
    {
        // First construct our complex data type:
        avro::RecordSchema myRecord("complex");
   
        // Now populate my record with fields (each field is another schema):
        myRecord.addField("real", avro::DoubleSchema());
        myRecord.addField("imaginary", avro::DoubleSchema());

        // The complex record is the same as used above, let's make a schema 
        // for an array of these record
  
        avro::ArraySchema complexArray(myRecord); 

        avro::ValidSchema validComplexArray(complexArray);
        validComplexArray.toJson(std::cout);
    }